

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_empty.cc
# Opt level: O0

void __thiscall re2c::Skeleton::warn_match_empty(Skeleton *this)

{
  Node *this_00;
  bool bVar1;
  set<re2c::rule_t,_std::less<re2c::rule_t>,_std::allocator<re2c::rule_t>_> *this_01;
  mapped_type *pmVar2;
  pointer prVar3;
  bool local_51;
  _Self local_48;
  _Self local_40;
  const_iterator i_1;
  _Self local_30;
  const_iterator i;
  bool reachable;
  set<re2c::rule_t,_std::less<re2c::rule_t>,_std::allocator<re2c::rule_t>_> *reach;
  Node *head;
  Skeleton *this_local;
  
  this_00 = this->nodes;
  Node::calc_reachable(this_00);
  this_01 = &this_00->reachable;
  bVar1 = rule_rank_t::is_none(&(this_00->rule).rank);
  if (!bVar1) {
    i._M_node._7_1_ = Node::end(this_00);
    local_30._M_node =
         (_Base_ptr)
         std::set<re2c::rule_t,_std::less<re2c::rule_t>,_std::allocator<re2c::rule_t>_>::begin
                   (this_01);
    while( true ) {
      local_51 = false;
      if ((i._M_node._7_1_ & 1) == 0) {
        i_1._M_node = (_Base_ptr)
                      std::set<re2c::rule_t,_std::less<re2c::rule_t>,_std::allocator<re2c::rule_t>_>
                      ::end(this_01);
        local_51 = std::operator!=(&local_30,&i_1);
      }
      if (local_51 == false) break;
      prVar3 = std::_Rb_tree_const_iterator<re2c::rule_t>::operator->(&local_30);
      bVar1 = rule_rank_t::is_none(&prVar3->rank);
      i._M_node._7_1_ = (i._M_node._7_1_ & 1) != 0 || bVar1;
      std::_Rb_tree_const_iterator<re2c::rule_t>::operator++(&local_30);
    }
    if ((i._M_node._7_1_ & 1) != 0) {
      pmVar2 = std::
               map<re2c::rule_rank_t,_re2c::rule_info_t,_std::less<re2c::rule_rank_t>,_std::allocator<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>_>
               ::operator[](&this->rules,&(this_00->rule).rank);
      Warn::match_empty_string((Warn *)warn,pmVar2->line);
    }
  }
  if ((this_00->ctx & 1U) != 0) {
    local_40._M_node =
         (_Base_ptr)
         std::set<re2c::rule_t,_std::less<re2c::rule_t>,_std::allocator<re2c::rule_t>_>::begin
                   (this_01);
    while( true ) {
      local_48._M_node =
           (_Base_ptr)
           std::set<re2c::rule_t,_std::less<re2c::rule_t>,_std::allocator<re2c::rule_t>_>::end
                     (this_01);
      bVar1 = std::operator!=(&local_40,&local_48);
      if (!bVar1) break;
      prVar3 = std::_Rb_tree_const_iterator<re2c::rule_t>::operator->(&local_40);
      if ((prVar3->restorectx & 1U) != 0) {
        prVar3 = std::_Rb_tree_const_iterator<re2c::rule_t>::operator->(&local_40);
        pmVar2 = std::
                 map<re2c::rule_rank_t,_re2c::rule_info_t,_std::less<re2c::rule_rank_t>,_std::allocator<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>_>
                 ::operator[](&this->rules,&prVar3->rank);
        Warn::match_empty_string((Warn *)warn,pmVar2->line);
      }
      std::_Rb_tree_const_iterator<re2c::rule_t>::operator++(&local_40);
    }
  }
  return;
}

Assistant:

void Skeleton::warn_match_empty ()
{
	Node & head = nodes[0];

	head.calc_reachable ();
	const std::set<rule_t> & reach = head.reachable;

	// warn about rules that match empty string
	if (!head.rule.rank.is_none ())
	{
		bool reachable = head.end ();
		for (std::set<rule_t>::const_iterator i = reach.begin ();
			!reachable && i != reach.end (); ++i)
		{
			reachable |= i->rank.is_none ();
		}
		if (reachable)
		{
			warn.match_empty_string (rules[head.rule.rank].line);
		}
	}

	// warn about rules that match empty string with nonempty trailing context
	if (head.ctx)
	{
		for (std::set<rule_t>::const_iterator i = reach.begin (); i != reach.end (); ++i)
		{
			if (i->restorectx)
			{
				warn.match_empty_string (rules[i->rank].line);
			}
		}
	}
}